

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_view_suite.cpp
# Opt level: O0

void api_dynamic_suite::dynamic_ctor_copy(void)

{
  undefined4 local_94;
  size_type local_90;
  undefined4 local_84;
  size_type local_80 [2];
  undefined1 local_70 [8];
  priority_view<int,_18446744073709551615UL,_std::less<int>_> clone;
  size_type local_48;
  undefined4 local_3c;
  size_type local_38 [2];
  undefined1 local_28 [8];
  priority_view<int,_18446744073709551615UL,_std::less<int>_> span;
  
  vista::priority_view<int,_18446744073709551615UL,_std::less<int>_>::priority_view
            ((priority_view<int,_18446744073709551615UL,_std::less<int>_> *)local_28);
  local_38[0] = vista::priority_view<int,_18446744073709551615UL,_std::less<int>_>::size
                          ((priority_view<int,_18446744073709551615UL,_std::less<int>_> *)local_28);
  local_3c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/priority_view_suite.cpp"
             ,0x27,"void api_dynamic_suite::dynamic_ctor_copy()",local_38,&local_3c);
  local_48 = vista::priority_view<int,_18446744073709551615UL,_std::less<int>_>::capacity
                       ((priority_view<int,_18446744073709551615UL,_std::less<int>_> *)local_28);
  clone.member.last._4_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.capacity()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/priority_view_suite.cpp"
             ,0x28,"void api_dynamic_suite::dynamic_ctor_copy()",&local_48,
             (undefined1 *)((long)&clone.member.last + 4));
  local_70 = local_28;
  clone.member._0_8_ = span.member._0_8_;
  clone.member.span.member.head = span.member.span.member.head;
  clone.member.span.member.tail = span.member.span.member.tail;
  local_80[0] = vista::priority_view<int,_18446744073709551615UL,_std::less<int>_>::size
                          ((priority_view<int,_18446744073709551615UL,_std::less<int>_> *)local_70);
  local_84 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("clone.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/priority_view_suite.cpp"
             ,0x2a,"void api_dynamic_suite::dynamic_ctor_copy()",local_80,&local_84);
  local_90 = vista::priority_view<int,_18446744073709551615UL,_std::less<int>_>::capacity
                       ((priority_view<int,_18446744073709551615UL,_std::less<int>_> *)local_70);
  local_94 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("clone.capacity()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/priority_view_suite.cpp"
             ,0x2b,"void api_dynamic_suite::dynamic_ctor_copy()",&local_90,&local_94);
  return;
}

Assistant:

void dynamic_ctor_copy()
{
    priority_view<int> span;
    BOOST_TEST_EQ(span.size(), 0);
    BOOST_TEST_EQ(span.capacity(), 0);
    priority_view<int> clone(span);
    BOOST_TEST_EQ(clone.size(), 0);
    BOOST_TEST_EQ(clone.capacity(), 0);
}